

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionModelBullet.cpp
# Opt level: O2

bool __thiscall
chrono::collision::ChCollisionModelBullet::AddCylinder
          (ChCollisionModelBullet *this,shared_ptr<chrono::ChMaterialSurface> *material,double rx,
          double rz,double hy,ChVector<double> *pos,ChMatrix33<double> *rot)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ChCollisionShapeBullet *this_00;
  cbtCollisionShape *this_01;
  float fVar4;
  double dVar5;
  undefined8 in_XMM0_Qb;
  undefined8 uVar9;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 uVar10;
  undefined1 auVar8 [16];
  undefined1 auVar11 [16];
  undefined8 in_XMM2_Qb;
  undefined1 auVar12 [16];
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  cbtVector3 local_40;
  
  dVar5 = rx;
  uVar9 = in_XMM0_Qb;
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x23])();
  auVar1._8_8_ = in_XMM0_Qb;
  auVar1._0_8_ = rx;
  auVar6._0_8_ = (double)SUB84(dVar5,0);
  auVar6._8_8_ = uVar9;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = rz;
  auVar7 = vminsd_avx(auVar1,auVar7);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = hy * 0.5;
  auVar7 = vminsd_avx(auVar7,auVar12);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = auVar7._0_8_ * 0.2;
  auVar7 = vminsd_avx(auVar6,auVar11);
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x22])(this);
  this_00 = (ChCollisionShapeBullet *)::operator_new(0x28);
  std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_78,
             &material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
  ChCollisionShapeBullet::ChCollisionShapeBullet
            (this_00,CYLINDER,(shared_ptr<chrono::ChMaterialSurface> *)&local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x25])(this);
  local_58 = auVar7;
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x25])(this);
  dVar5 = (double)auVar7._0_4_ + rz;
  fVar4 = (float)dVar5;
  uVar9 = CONCAT44((int)((ulong)dVar5 >> 0x20),fVar4);
  uVar10 = 0;
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x25])(this);
  local_68 = uVar9;
  uStack_60 = uVar10;
  this_01 = (cbtCollisionShape *)cbtCylinderShape::operator_new(0x48);
  auVar2._8_8_ = in_XMM0_Qb;
  auVar2._0_8_ = rx;
  auVar7 = vinsertps_avx(local_58,ZEXT416((uint)local_68),0x10);
  auVar3._8_8_ = in_XMM2_Qb;
  auVar3._0_8_ = hy;
  auVar1 = vunpcklpd_avx(auVar2,auVar3);
  auVar7 = vcvtps2pd_avx(auVar7);
  auVar8._0_8_ = auVar1._0_8_ + auVar7._0_8_;
  auVar8._8_8_ = auVar1._8_8_ + auVar7._8_8_;
  auVar7 = vcvtpd2ps_avx(auVar8);
  local_40.m_floats._0_8_ = vmovlps_avx(auVar7);
  local_40.m_floats[3] = 0.0;
  local_40.m_floats[2] = fVar4;
  cbtCylinderShape::cbtCylinderShape((cbtCylinderShape *)this_01,&local_40);
  this_00->m_bt_shape = this_01;
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x2b])(this);
  (*this_01->_vptr_cbtCollisionShape[0xb])(this_01);
  injectShape(this,pos,rot,this_00);
  return true;
}

Assistant:

bool ChCollisionModelBullet::AddCylinder(std::shared_ptr<ChMaterialSurface> material,
                                         double rx,
                                         double rz,
                                         double hy,
                                         const ChVector<>& pos,
                                         const ChMatrix33<>& rot) {
    // adjust default inward margin (if object too thin)
    SetSafeMargin(ChMin(GetSafeMargin(), 0.2 * ChMin(ChMin(rx, rz), 0.5 * hy)));

    auto shape = new ChCollisionShapeBullet(ChCollisionShape::Type::CYLINDER, material);

    cbtScalar arx = (cbtScalar)(rx + GetEnvelope());
    cbtScalar arz = (cbtScalar)(rz + GetEnvelope());
    cbtScalar ahy = (cbtScalar)(hy + GetEnvelope());
    shape->m_bt_shape = new cbtCylinderShape(cbtVector3(arx, ahy, arz));
    shape->m_bt_shape->setMargin((cbtScalar)GetSuggestedFullMargin());

    injectShape(pos, rot, shape);
    return true;
}